

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEditPrivate::getMaximum(QDateTimeEditPrivate *this)

{
  long in_RSI;
  
  getMaximum(this,(QTimeZone *)(in_RSI + -0x3d8));
  return;
}

Assistant:

QDateTime QDateTimeEditPrivate::getMaximum(const QTimeZone &zone) const
{
    if (keyboardTracking)
        return maximum.toDateTime().toTimeZone(zone);

    // QDTP's max is the local-time end of QDATETIMEEDIT_DATE_MAX, cached
    // (along with its conversion to UTC).
    if (timeZone.timeSpec() == Qt::LocalTime)
        return QDateTimeParser::getMaximum(zone);

    return QDATETIMEEDIT_DATE_MAX.endOfDay(timeZone).toTimeZone(zone);
}